

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
PFData::fileReadSubgridAtGridIndex(PFData *this,int gridZ,int gridY,int gridX)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int in_R8D;
  int ret;
  fpos_t pos;
  long count;
  vector<double,_std::allocator<double>_> *result;
  undefined8 in_stack_ffffffffffffff28;
  PFData *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  int gridX_00;
  undefined8 in_stack_ffffffffffffff50;
  FILE *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  fpos_t local_58 [2];
  undefined1 local_29;
  long local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  gridX_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  iVar1 = getSubgridSizeZ(in_stack_ffffffffffffff30,iVar3);
  iVar2 = getSubgridSizeY(in_stack_ffffffffffffff30,iVar3);
  iVar3 = getSubgridSizeX(in_stack_ffffffffffffff30,iVar3);
  local_28 = (long)(iVar1 * iVar2 * iVar3);
  local_29 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x131bb3);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (allocator_type *)in_stack_ffffffffffffff30);
  std::allocator<double>::~allocator((allocator<double> *)0x131bd9);
  local_58[0].__pos = 0;
  local_58[0].__state.__count = 0;
  local_58[0].__state.__value = (_union_27)0x0;
  fgetpos(*(FILE **)(in_RSI + 0x20),local_58);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x131c06);
  iVar1 = fileReadSubgridAtGridIndexInternal
                    ((PFData *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50,
                     gridX_00);
  fsetpos(*(FILE **)(in_RSI + 0x20),local_58);
  if (iVar1 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Error while reading subgrid at subgrid index(ZYX): {");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
    poVar4 = std::operator<<(poVar4,"}, error code ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,": ");
    pcVar5 = strerror(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\n");
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x131d7a);
  }
  return in_RDI;
}

Assistant:

std::vector<double> PFData::fileReadSubgridAtGridIndex(int gridZ, int gridY, int gridX){
    const long count = getSubgridSizeZ(gridZ) * getSubgridSizeY(gridY) * getSubgridSizeX(gridX);

    //Fill with empty data
    std::vector<double> result(count);

    std::fpos_t pos{};
    //Save old position
    std::fgetpos(m_fp, &pos);

    int ret = fileReadSubgridAtGridIndexInternal(result.data(), m_fp, gridZ, gridY, gridX);

    //Restore old position
    std::fsetpos(m_fp, &pos);

    if(ret){
        std::cerr << "Error while reading subgrid at subgrid index(ZYX): {" << gridZ << ", " << gridY << ", " << gridX << "}, error code " << ret << ": " << std::strerror(ret) << "\n";
        result.clear();
    }

    return result;
}